

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

string * __thiscall Product::getParameter(string *__return_storage_ptr__,Product *this,string *name)

{
  bool bVar1;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream parameter;
  ostream local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  Product *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (Product *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = std::operator==(local_20,"factor");
  if (bVar1) {
    std::ostream::operator<<(&local_198,this->productFactor);
  }
  else {
    Parametric::getParameter(&local_1d8,(Parametric *)this,local_20);
    std::operator<<(&local_198,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string Product::getParameter(const string& name) const
{
	stringstream parameter;
	if (name=="factor")
		parameter << productFactor;
	else
		parameter << StochasticFunction::getParameter(name);

	return parameter.str();
}